

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O3

void __thiscall
crnlib::corpus_tester::print_metric_stats
          (corpus_tester *this,vector<crnlib::image_utils::error_metrics> *stats,uint num_blocks_x,
          uint num_blocks_y)

{
  double dVar1;
  ulong uVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  undefined4 in_register_00000014;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  uVar4 = CONCAT44(in_register_00000014,num_blocks_x);
  uVar3 = CONCAT44(in_register_0000000c,num_blocks_y);
  if ((ulong)stats->m_size == 0) {
    uVar5 = 0;
    dVar16 = 0.0;
    dVar17 = 0.0;
    dVar14 = 1000000.0;
    dVar15 = 0.0;
    uVar6 = 0;
    uVar12 = 0;
    uVar13 = 0;
    uVar8 = 0;
    uVar11 = 0;
  }
  else {
    uVar3 = (ulong)num_blocks_x;
    pdVar10 = &stats->m_p->mPeakSNR;
    dVar16 = 0.0;
    dVar17 = 0.0;
    dVar15 = 0.0;
    dVar14 = 1000000.0;
    uVar9 = 0;
    uVar11 = 0;
    uVar8 = 0;
    uVar13 = 0;
    uVar12 = 0;
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar2 = (uVar9 & 0xffffffff) / uVar3;
      uVar4 = (uVar9 & 0xffffffff) % uVar3;
      dVar1 = *pdVar10;
      if (dVar1 < 200.0 && dVar15 < dVar1) {
        uVar7 = uVar4;
        dVar15 = dVar1;
        uVar5 = uVar2;
      }
      uVar6 = (uint)uVar7;
      if (dVar1 < dVar14) {
        uVar13 = uVar4;
        uVar12 = uVar2;
      }
      if (200.0 <= dVar1) {
        uVar8 = (ulong)((int)uVar8 + 1);
      }
      else {
        dVar16 = dVar16 + dVar1 * dVar1;
        dVar17 = dVar17 + dVar1;
        uVar11 = uVar11 + 1;
      }
      if (dVar14 <= dVar1) {
        dVar1 = dVar14;
      }
      dVar14 = dVar1;
      uVar9 = uVar9 + 1;
      pdVar10 = pdVar10 + 5;
    } while (stats->m_size != uVar9);
  }
  console::printf("Number of infinite PSNR blocks: %u",uVar8,uVar4,uVar3);
  console::printf("Number of non-infinite PSNR blocks: %u",(ulong)uVar11);
  if (uVar11 != 0) {
    dVar17 = dVar17 * (1.0 / (double)uVar11);
    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f",dVar17,
                    SQRT(dVar16 * (1.0 / (double)uVar11) - dVar17 * dVar17));
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i",dVar14,uVar13,uVar12);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i",dVar15,(ulong)uVar6,uVar5);
    return;
  }
  return;
}

Assistant:

void corpus_tester::print_metric_stats(const crnlib::vector<image_utils::error_metrics>& stats, uint num_blocks_x, uint num_blocks_y) {
  num_blocks_y;

  image_utils::error_metrics best_metrics;
  image_utils::error_metrics worst_metrics;
  worst_metrics.mPeakSNR = 1e+6f;

  vec2I best_loc;
  vec2I worst_loc;
  utils::zero_object(best_loc);
  utils::zero_object(worst_loc);

  double psnr_total = 0.0f;
  double psnr2_total = 0.0f;
  uint num_non_inf = 0;
  uint num_inf = 0;

  for (uint i = 0; i < stats.size(); i++) {
    uint bx = i % num_blocks_x;
    uint by = i / num_blocks_x;

    const image_utils::error_metrics& em = stats[i];

    if ((em.mPeakSNR < 200.0f) && (em > best_metrics)) {
      best_metrics = em;
      best_loc.set(bx, by);
    }
    if (em < worst_metrics) {
      worst_metrics = em;
      worst_loc.set(bx, by);
    }

    if (em.mPeakSNR < 200.0f) {
      psnr_total += em.mPeakSNR;
      psnr2_total += em.mPeakSNR * em.mPeakSNR;
      num_non_inf++;
    } else {
      num_inf++;
    }
  }

  console::printf("Number of infinite PSNR blocks: %u", num_inf);
  console::printf("Number of non-infinite PSNR blocks: %u", num_non_inf);
  if (num_non_inf) {
    psnr_total /= num_non_inf;
    psnr2_total /= num_non_inf;

    double psnr_std_dev = sqrt(psnr2_total - psnr_total * psnr_total);

    console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f", psnr_total, psnr_std_dev);
    console::printf("Worst PSNR: %3.3f, Block Location: %i,%i", worst_metrics.mPeakSNR, worst_loc[0], worst_loc[1]);
    console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i", best_metrics.mPeakSNR, best_loc[0], best_loc[1]);
  }
}